

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::LoadLWO2TextureBlock(LWOImporter *this,SubChunkHeader *head,uint size)

{
  uint32_t uVar1;
  pointer pSVar2;
  int iVar3;
  Logger *this_00;
  _List_node_base *this_01;
  uint uVar4;
  LWOImporter *this_02;
  const_iterator __position;
  long lStack_d0;
  Texture tex;
  
  pSVar2 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->mSurfaces->
      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
      super__Vector_impl_data._M_start == pSVar2) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x270,
                  "void Assimp::LWOImporter::LoadLWO2TextureBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  LWO::Texture::Texture(&tex);
  uVar4 = (uint)head->length;
  this_02 = this;
  LoadLWO2TextureHeader(this,(uint)head->length,&tex);
  uVar1 = head->type;
  if (uVar1 == 0x47524144) {
    LoadLWO2Gradient(this_02,uVar4,&tex);
  }
  else if (uVar1 == 0x494d4150) {
    LoadLWO2ImageMap(this,(size - head->length) - 6,&tex);
  }
  else if (uVar1 == 0x50524f43) {
    LoadLWO2Procedural(this_02,uVar4,&tex);
  }
  if (tex.type == 0x42554d50) {
    lStack_d0 = -0x58;
  }
  else if (tex.type == 0x434f4c52) {
    lStack_d0 = -0xb8;
  }
  else if (tex.type == 0x5452414e) {
    lStack_d0 = -0x70;
  }
  else if (tex.type == 0x474c4f53) {
    lStack_d0 = -0x40;
  }
  else if (tex.type == 0x5245464c) {
    lStack_d0 = -0x28;
  }
  else if (tex.type == 0x53504543) {
    lStack_d0 = -0x88;
  }
  else {
    if (tex.type != 0x44494646) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"LWO2: Encountered unknown texture type");
      goto LAB_0041efa7;
    }
    lStack_d0 = -0xa0;
  }
  this_01 = (_List_node_base *)((long)&(pSVar2->mName)._M_dataplus._M_p + lStack_d0);
  __position._M_node = this_01;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == this_01) {
      std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::push_back
                ((list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)this_01,&tex);
      goto LAB_0041efa7;
    }
    iVar3 = strcmp(tex.ordinal._M_dataplus._M_p,(char *)__position._M_node[8]._M_prev);
  } while (-1 < iVar3);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::insert
            ((list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)this_01,__position
             ,&tex);
LAB_0041efa7:
  LWO::Texture::~Texture(&tex);
  return;
}

Assistant:

void LWOImporter::LoadLWO2TextureBlock(LE_NCONST IFF::SubChunkHeader* head, unsigned int size )
{
    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture tex;

    // load the texture header
    LoadLWO2TextureHeader(head->length,tex);
    size -= head->length + 6;

    // now get the exact type of the texture
    switch (head->type)
    {
    case AI_LWO_PROC:
        LoadLWO2Procedural(size,tex);
        break;
    case AI_LWO_GRAD:
        LoadLWO2Gradient(size,tex);
        break;
    case AI_LWO_IMAP:
        LoadLWO2ImageMap(size,tex);
    }

    // get the destination channel
    TextureList* listRef = NULL;
    switch (tex.type)
    {
    case AI_LWO_COLR:
        listRef = &surf.mColorTextures;break;
    case AI_LWO_DIFF:
        listRef = &surf.mDiffuseTextures;break;
    case AI_LWO_SPEC:
        listRef = &surf.mSpecularTextures;break;
    case AI_LWO_GLOS:
        listRef = &surf.mGlossinessTextures;break;
    case AI_LWO_BUMP:
        listRef = &surf.mBumpTextures;break;
    case AI_LWO_TRAN:
        listRef = &surf.mOpacityTextures;break;
    case AI_LWO_REFL:
        listRef = &surf.mReflectionTextures;break;
    default:
        ASSIMP_LOG_WARN("LWO2: Encountered unknown texture type");
        return;
    }

    // now attach the texture to the parent surface - sort by ordinal string
    for (TextureList::iterator it = listRef->begin();it != listRef->end(); ++it)    {
        if (::strcmp(tex.ordinal.c_str(),(*it).ordinal.c_str()) < 0)    {
            listRef->insert(it,tex);
            return;
        }
    }
    listRef->push_back(tex);
}